

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 GenStateCompileCaseExpr(jx9_gen_state *pGen,jx9_case_expr *pExpr)

{
  uint uVar1;
  SyToken *pSVar2;
  jx9_vm *pjVar3;
  SySet *pSVar4;
  sxi32 sVar5;
  sxi32 sVar6;
  int iVar7;
  jx9_case_expr *pjVar8;
  SyToken *pSVar9;
  SyToken *pSVar10;
  SySet *pSVar11;
  
  pSVar2 = pGen->pIn;
  pSVar10 = pGen->pEnd;
  pSVar9 = pSVar2;
  if (pSVar2 < pSVar10) {
    iVar7 = 0;
    do {
      uVar1 = pSVar9->nType;
      if ((uVar1 >> 9 & 1) == 0) {
        if ((uVar1 >> 10 & 1) == 0) {
          if (((uVar1 & 0x140000) != 0) && (iVar7 < 1)) break;
        }
        else {
          iVar7 = iVar7 + -1;
        }
      }
      else {
        iVar7 = iVar7 + 1;
      }
      pSVar9 = pSVar9 + 1;
    } while (pSVar9 < pSVar10);
    if (pSVar2 < pSVar9) goto LAB_00127f09;
  }
  sVar5 = jx9GenCompileError(pGen,1,pSVar2->nLine,"Empty case expression");
  if (sVar5 == -10) {
    return -10;
  }
  pSVar10 = pGen->pEnd;
LAB_00127f09:
  pGen->pEnd = pSVar9;
  pjVar3 = pGen->pVm;
  pSVar4 = pjVar3->pByteContainer;
  pjVar8 = (jx9_case_expr *)&pjVar3->aByteCode;
  if (pExpr != (jx9_case_expr *)0x0) {
    pjVar8 = pExpr;
  }
  pjVar3->pByteContainer = &pjVar8->aByteCode;
  sVar5 = 0;
  sVar6 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
  jx9VmEmitInstr(pGen->pVm,1,(uint)(sVar6 != -3),0,(void *)0x0,(sxu32 *)0x0);
  pSVar11 = &pGen->pVm->aByteCode;
  if (pSVar4 != (SySet *)0x0) {
    pSVar11 = pSVar4;
  }
  pGen->pVm->pByteContainer = pSVar11;
  pGen->pIn = pSVar9;
  pGen->pEnd = pSVar10;
  if (sVar6 == -10) {
    sVar5 = -10;
  }
  return sVar5;
}

Assistant:

static sxi32 GenStateCompileCaseExpr(jx9_gen_state *pGen, jx9_case_expr *pExpr)
{
	SySet *pInstrContainer;
	SyToken *pEnd, *pTmp;
	sxi32 iNest = 0;
	sxi32 rc;
	/* Delimit the expression */
	pEnd = pGen->pIn;
	while( pEnd < pGen->pEnd ){
		if( pEnd->nType & JX9_TK_LPAREN /*(*/ ){
			/* Increment nesting level */
			iNest++;
		}else if( pEnd->nType & JX9_TK_RPAREN /*)*/ ){
			/* Decrement nesting level */
			iNest--;
		}else if( pEnd->nType & (JX9_TK_SEMI/*';'*/|JX9_TK_COLON/*;'*/) && iNest < 1 ){
			break;
		}
		pEnd++;
	}
	if( pGen->pIn >= pEnd ){
		rc = jx9GenCompileError(pGen, E_ERROR, pGen->pIn->nLine, "Empty case expression");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}
	/* Swap token stream */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	pInstrContainer = jx9VmGetByteCodeContainer(pGen->pVm);
	jx9VmSetByteCodeContainer(pGen->pVm, &pExpr->aByteCode);
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Emit the done instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_DONE, (rc != SXERR_EMPTY ? 1 : 0), 0, 0, 0);
	jx9VmSetByteCodeContainer(pGen->pVm, pInstrContainer); 
	/* Update token stream */
	pGen->pIn  = pEnd;
	pGen->pEnd = pTmp;
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	return SXRET_OK;
}